

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::CallRef::finalize(CallRef *this)

{
  bool bVar1;
  Type local_28;
  BasicType local_1c;
  Type local_18;
  CallRef *local_10;
  CallRef *this_local;
  
  local_10 = this;
  handleUnreachableOperands<wasm::CallRef>(this);
  if ((this->isReturn & 1U) != 0) {
    wasm::Type::Type(&local_18,unreachable);
    (this->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id =
         local_18.id;
  }
  local_1c = unreachable;
  bVar1 = wasm::Type::operator==(&this->target->type,&local_1c);
  if (bVar1) {
    wasm::Type::Type(&local_28,unreachable);
    (this->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id =
         local_28.id;
  }
  return;
}

Assistant:

void CallRef::finalize() {
  handleUnreachableOperands(this);
  if (isReturn) {
    type = Type::unreachable;
  }
  if (target->type == Type::unreachable) {
    type = Type::unreachable;
  }
}